

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.h
# Opt level: O2

optional<pbrt::FilterFunction> __thiscall pbrt::ParseFilter(pbrt *this,string *f)

{
  bool bVar1;
  
  bVar1 = std::operator==(f,"ewa");
  if ((bVar1) || (bVar1 = std::operator==(f,"EWA"), bVar1)) {
    this[4] = (pbrt)0x1;
    *(undefined4 *)this = 3;
    return (optional<pbrt::FilterFunction>)this;
  }
  bVar1 = std::operator==(f,"trilinear");
  if (bVar1) {
    this[4] = (pbrt)0x1;
    *(undefined4 *)this = 2;
    return (optional<pbrt::FilterFunction>)this;
  }
  bVar1 = std::operator==(f,"bilinear");
  if (bVar1) {
    this[4] = (pbrt)0x1;
    *(undefined4 *)this = 1;
    return (optional<pbrt::FilterFunction>)this;
  }
  bVar1 = std::operator==(f,"point");
  if (bVar1) {
    this[4] = (pbrt)0x1;
    *(undefined4 *)this = 0;
    return (optional<pbrt::FilterFunction>)this;
  }
  *(undefined8 *)this = 0;
  return (optional<pbrt::FilterFunction>)this;
}

Assistant:

inline pstd::optional<FilterFunction> ParseFilter(const std::string &f) {
    if (f == "ewa" || f == "EWA")
        return FilterFunction::EWA;
    else if (f == "trilinear")
        return FilterFunction::Trilinear;
    else if (f == "bilinear")
        return FilterFunction::Bilinear;
    else if (f == "point")
        return FilterFunction::Point;
    else
        return {};
}